

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccm.c
# Opt level: O1

int ccm_auth_crypt(mbedtls_ccm_context *ctx,int mode,size_t length,uchar *iv,size_t iv_len,
                  uchar *add,size_t add_len,uchar *input,uchar *output,uchar *tag,size_t tag_len)

{
  size_t sVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  byte bVar7;
  long lVar8;
  size_t __n;
  byte bVar9;
  size_t sVar10;
  uchar *puVar11;
  bool bVar12;
  bool bVar13;
  uchar y [16];
  uchar ctr [16];
  undefined8 local_a8;
  undefined8 uStack_a0;
  mbedtls_cipher_context_t *local_98;
  size_t local_90;
  byte local_88 [28];
  int local_6c;
  size_t local_68;
  int local_5c;
  uchar local_58 [15];
  undefined1 local_49;
  ulong local_48;
  ulong local_40;
  uchar *local_38;
  
  iVar3 = -0xd;
  iVar2 = -0xd;
  if ((((add_len < 0xff01) && (0xfffffffffffffff8 < iv_len - 0xe)) &&
      (0xfffffffffffffff2 < tag_len - 0x11)) && ((tag_len & 1) == 0)) {
    bVar9 = 0xf - (char)iv_len;
    local_5c = bVar9 - 1;
    local_a8 = CONCAT71(local_a8._1_7_,
                        (add_len != 0) << 6 | (char)tag_len * '\x04' - 8U & 0xf8 | (byte)local_5c);
    local_98 = &ctx->cipher_ctx;
    local_6c = mode;
    local_40 = length;
    local_38 = iv;
    memcpy((void *)((long)&local_a8 + 1),iv,iv_len);
    local_68 = iv_len;
    uVar5 = local_40;
    if (iv_len != 0xf) {
      lVar8 = 0;
      do {
        *(char *)((long)&uStack_a0 + lVar8 + 7) = (char)uVar5;
        uVar5 = uVar5 >> 8;
        lVar8 = lVar8 + -1;
      } while (-lVar8 != (ulong)bVar9);
    }
    local_48 = (ulong)bVar9;
    if (uVar5 == 0) {
      local_88[0] = 0;
      local_88[1] = 0;
      local_88[2] = 0;
      local_88[3] = 0;
      local_88[4] = 0;
      local_88[5] = 0;
      local_88[6] = 0;
      local_88[7] = 0;
      local_88[8] = 0;
      local_88[9] = 0;
      local_88[10] = 0;
      local_88[0xb] = 0;
      local_88[0xc] = 0;
      local_88[0xd] = 0;
      local_88[0xe] = 0;
      local_88[0xf] = 0;
      lVar8 = 0;
      do {
        local_88[lVar8] = local_88[lVar8] ^ *(byte *)((long)&local_a8 + lVar8);
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0x10);
      iVar2 = mbedtls_cipher_update(local_98,local_88,0x10,local_88,&local_90);
      if (iVar2 == 0) {
        if (add_len != 0) {
          uStack_a0 = 0;
          local_a8 = (ulong)CONCAT11((char)add_len,(char)(add_len >> 8));
          sVar10 = 0xe;
          if (add_len < 0xe) {
            sVar10 = add_len;
          }
          memcpy((void *)((long)&local_a8 + 2),add,sVar10);
          uVar5 = add_len - sVar10;
          lVar8 = 0;
          do {
            local_88[lVar8] = local_88[lVar8] ^ *(byte *)((long)&local_a8 + lVar8);
            lVar8 = lVar8 + 1;
          } while (lVar8 != 0x10);
          iVar2 = mbedtls_cipher_update(local_98,local_88,0x10,local_88,&local_90);
          if (iVar2 == 0) {
            if (uVar5 == 0) {
              bVar13 = true;
            }
            else {
              puVar11 = add + sVar10;
              do {
                sVar10 = 0x10;
                if (uVar5 < 0x10) {
                  sVar10 = uVar5;
                }
                __n = 0x10 - sVar10;
                if (0xf < uVar5) {
                  __n = 0;
                }
                memset((void *)((long)&local_a8 + sVar10),0,__n);
                memcpy(&local_a8,puVar11,sVar10);
                lVar8 = 0;
                do {
                  local_88[lVar8] = local_88[lVar8] ^ *(byte *)((long)&local_a8 + lVar8);
                  lVar8 = lVar8 + 1;
                } while (lVar8 != 0x10);
                iVar3 = mbedtls_cipher_update(local_98,local_88,0x10,local_88,&local_90);
                bVar13 = iVar3 == 0;
                if (!bVar13) break;
                uVar5 = uVar5 - sVar10;
                puVar11 = puVar11 + sVar10;
              } while (uVar5 != 0);
            }
          }
          else {
            bVar13 = false;
            iVar3 = iVar2;
          }
          if (!bVar13) {
            return iVar3;
          }
        }
        sVar1 = local_68;
        local_58[0] = (uchar)local_5c;
        memcpy(local_58 + 1,local_38,local_68);
        memset(local_58 + sVar1 + 1,0,local_48);
        local_49 = 1;
        uVar5 = local_40;
        iVar2 = iVar3;
        do {
          if (uVar5 == 0) {
            if (local_68 != 0xf) {
              uVar4 = 1;
              if (1 < bVar9) {
                uVar4 = (uint)local_48;
              }
              uVar5 = 0xf;
              do {
                local_58[uVar5 & 0xffffffff] = '\0';
                lVar8 = (uVar4 & 0xff) + uVar5;
                uVar5 = uVar5 - 1;
              } while (lVar8 != 0x10);
            }
            iVar3 = mbedtls_cipher_update(local_98,local_58,0x10,(uchar *)&local_a8,&local_90);
            if (iVar3 != 0) {
              return iVar3;
            }
            lVar8 = 0;
            do {
              local_88[lVar8] = local_88[lVar8] ^ *(byte *)((long)&local_a8 + lVar8);
              lVar8 = lVar8 + 1;
            } while (lVar8 != 0x10);
            memcpy(tag,local_88,tag_len);
            return 0;
          }
          sVar10 = 0x10;
          if (uVar5 < 0x10) {
            sVar10 = uVar5;
          }
          if (local_6c == 0) {
            local_a8 = 0;
            uStack_a0 = 0;
            memcpy(&local_a8,input,sVar10);
            lVar8 = 0;
            do {
              local_88[lVar8] = local_88[lVar8] ^ *(byte *)((long)&local_a8 + lVar8);
              lVar8 = lVar8 + 1;
            } while (lVar8 != 0x10);
            iVar3 = mbedtls_cipher_update(local_98,local_88,0x10,local_88,&local_90);
            if (iVar3 == 0) goto LAB_0010e8b5;
LAB_0010e9dd:
            bVar13 = false;
            iVar2 = iVar3;
          }
          else {
LAB_0010e8b5:
            iVar3 = mbedtls_cipher_update(local_98,local_58,0x10,(uchar *)&local_a8,&local_90);
            if (iVar3 != 0) goto LAB_0010e9dd;
            lVar8 = 0;
            do {
              output[lVar8] = *(byte *)((long)&local_a8 + lVar8) ^ input[lVar8];
              lVar8 = lVar8 + 1;
            } while (sVar10 + (sVar10 == 0) != lVar8);
            if (local_6c == 1) {
              local_a8 = 0;
              uStack_a0 = 0;
              memcpy(&local_a8,output,sVar10);
              lVar8 = 0;
              do {
                local_88[lVar8] = local_88[lVar8] ^ *(byte *)((long)&local_a8 + lVar8);
                lVar8 = lVar8 + 1;
              } while (lVar8 != 0x10);
              iVar3 = mbedtls_cipher_update(local_98,local_88,0x10,local_88,&local_90);
              if (iVar3 != 0) goto LAB_0010e9dd;
            }
            output = output + sVar10;
            input = input + sVar10;
            uVar5 = uVar5 - sVar10;
            bVar13 = true;
            if (local_68 != 0xf) {
              bVar13 = true;
              uVar6 = 0xf;
              bVar7 = 1;
              do {
                puVar11 = local_58 + (uVar6 & 0xffffffff);
                *puVar11 = *puVar11 + '\x01';
                if (*puVar11 != '\0') break;
                uVar6 = uVar6 - 1;
                bVar12 = bVar7 < bVar9;
                bVar7 = bVar7 + 1;
              } while (bVar12);
            }
          }
        } while (bVar13);
      }
    }
  }
  return iVar2;
}

Assistant:

static int ccm_auth_crypt( mbedtls_ccm_context *ctx, int mode, size_t length,
                           const unsigned char *iv, size_t iv_len,
                           const unsigned char *add, size_t add_len,
                           const unsigned char *input, unsigned char *output,
                           unsigned char *tag, size_t tag_len )
{
    int ret;
    unsigned char i;
    unsigned char q;
    size_t len_left, olen;
    unsigned char b[16];
    unsigned char y[16];
    unsigned char ctr[16];
    const unsigned char *src;
    unsigned char *dst;

    /*
     * Check length requirements: SP800-38C A.1
     * Additional requirement: a < 2^16 - 2^8 to simplify the code.
     * 'length' checked later (when writing it to the first block)
     */
    if( tag_len < 4 || tag_len > 16 || tag_len % 2 != 0 )
        return( MBEDTLS_ERR_CCM_BAD_INPUT );

    /* Also implies q is within bounds */
    if( iv_len < 7 || iv_len > 13 )
        return( MBEDTLS_ERR_CCM_BAD_INPUT );

    if( add_len > 0xFF00 )
        return( MBEDTLS_ERR_CCM_BAD_INPUT );

    q = 16 - 1 - (unsigned char) iv_len;

    /*
     * First block B_0:
     * 0        .. 0        flags
     * 1        .. iv_len   nonce (aka iv)
     * iv_len+1 .. 15       length
     *
     * With flags as (bits):
     * 7        0
     * 6        add present?
     * 5 .. 3   (t - 2) / 2
     * 2 .. 0   q - 1
     */
    b[0] = 0;
    b[0] |= ( add_len > 0 ) << 6;
    b[0] |= ( ( tag_len - 2 ) / 2 ) << 3;
    b[0] |= q - 1;

    memcpy( b + 1, iv, iv_len );

    for( i = 0, len_left = length; i < q; i++, len_left >>= 8 )
        b[15-i] = (unsigned char)( len_left & 0xFF );

    if( len_left > 0 )
        return( MBEDTLS_ERR_CCM_BAD_INPUT );


    /* Start CBC-MAC with first block */
    memset( y, 0, 16 );
    UPDATE_CBC_MAC;

    /*
     * If there is additional data, update CBC-MAC with
     * add_len, add, 0 (padding to a block boundary)
     */
    if( add_len > 0 )
    {
        size_t use_len;
        len_left = add_len;
        src = add;

        memset( b, 0, 16 );
        b[0] = (unsigned char)( ( add_len >> 8 ) & 0xFF );
        b[1] = (unsigned char)( ( add_len      ) & 0xFF );

        use_len = len_left < 16 - 2 ? len_left : 16 - 2;
        memcpy( b + 2, src, use_len );
        len_left -= use_len;
        src += use_len;

        UPDATE_CBC_MAC;

        while( len_left > 0 )
        {
            use_len = len_left > 16 ? 16 : len_left;

            memset( b, 0, 16 );
            memcpy( b, src, use_len );
            UPDATE_CBC_MAC;

            len_left -= use_len;
            src += use_len;
        }
    }

    /*
     * Prepare counter block for encryption:
     * 0        .. 0        flags
     * 1        .. iv_len   nonce (aka iv)
     * iv_len+1 .. 15       counter (initially 1)
     *
     * With flags as (bits):
     * 7 .. 3   0
     * 2 .. 0   q - 1
     */
    ctr[0] = q - 1;
    memcpy( ctr + 1, iv, iv_len );
    memset( ctr + 1 + iv_len, 0, q );
    ctr[15] = 1;

    /*
     * Authenticate and {en,de}crypt the message.
     *
     * The only difference between encryption and decryption is
     * the respective order of authentication and {en,de}cryption.
     */
    len_left = length;
    src = input;
    dst = output;

    while( len_left > 0 )
    {
        size_t use_len = len_left > 16 ? 16 : len_left;

        if( mode == CCM_ENCRYPT )
        {
            memset( b, 0, 16 );
            memcpy( b, src, use_len );
            UPDATE_CBC_MAC;
        }

        CTR_CRYPT( dst, src, use_len );

        if( mode == CCM_DECRYPT )
        {
            memset( b, 0, 16 );
            memcpy( b, dst, use_len );
            UPDATE_CBC_MAC;
        }

        dst += use_len;
        src += use_len;
        len_left -= use_len;

        /*
         * Increment counter.
         * No need to check for overflow thanks to the length check above.
         */
        for( i = 0; i < q; i++ )
            if( ++ctr[15-i] != 0 )
                break;
    }

    /*
     * Authentication: reset counter and crypt/mask internal tag
     */
    for( i = 0; i < q; i++ )
        ctr[15-i] = 0;

    CTR_CRYPT( y, y, 16 );
    memcpy( tag, y, tag_len );

    return( 0 );
}